

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxcover.cpp
# Opt level: O0

size_t sets_union<512ul,std::array<unsigned_long,5ul>>
                 (vector<std::bitset<512UL>,_std::allocator<std::bitset<512UL>_>_> *binary_sets,
                 array<unsigned_long,_5UL> *c)

{
  const_reference pvVar1;
  const_reference pvVar2;
  size_type sVar3;
  size_t sVar4;
  ulong local_60;
  size_t i;
  value_type x;
  array<unsigned_long,_5UL> *c_local;
  vector<std::bitset<512UL>,_std::allocator<std::bitset<512UL>_>_> *binary_sets_local;
  
  x.super__Base_bitset<8UL>._M_w[7] = (_WordT)c;
  pvVar1 = std::array<unsigned_long,_5UL>::operator[](c,0);
  pvVar2 = std::vector<std::bitset<512UL>,_std::allocator<std::bitset<512UL>_>_>::operator[]
                     (binary_sets,*pvVar1);
  memcpy(&i,pvVar2,0x40);
  local_60 = 1;
  while( true ) {
    sVar3 = std::array<unsigned_long,_5UL>::size
                      ((array<unsigned_long,_5UL> *)x.super__Base_bitset<8UL>._M_w[7]);
    if (sVar3 <= local_60) break;
    pvVar1 = std::array<unsigned_long,_5UL>::operator[]
                       ((array<unsigned_long,_5UL> *)x.super__Base_bitset<8UL>._M_w[7],local_60);
    pvVar2 = std::vector<std::bitset<512UL>,_std::allocator<std::bitset<512UL>_>_>::operator[]
                       (binary_sets,*pvVar1);
    std::bitset<512UL>::operator|=((bitset<512UL> *)&i,pvVar2);
    local_60 = local_60 + 1;
  }
  sVar4 = std::bitset<512UL>::count((bitset<512UL> *)&i);
  return sVar4;
}

Assistant:

size_t sets_union(const std::vector<std::bitset<n_entities>>& binary_sets, const Collection& c)
{
    auto x = binary_sets[c[0]];
    for (size_t i = 1; i < c.size(); ++i)
        x |= binary_sets[c[i]];
    return x.count();
}